

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.hpp
# Opt level: O3

int __thiscall
re::beatnik::viterbi<float,_256L>::decode(viterbi<float,_256L> *this,span<const_float,_256L> input)

{
  array<float,_256UL> *in;
  float fVar1;
  array<float,_256UL> *paVar2;
  long lVar3;
  array<float,_256UL> *paVar4;
  float fVar5;
  
  calculate_transition(this,input);
  in = &this->delta;
  math::normalize<float,256l,256l>((span<const_float,_256L>)in,(span<float,_256L>)in);
  fVar5 = (this->delta)._M_elems[0];
  lVar3 = 0;
  paVar4 = in;
  do {
    fVar1 = *(float *)((long)(this->delta)._M_elems + lVar3 + 4);
    paVar2 = (array<float,_256UL> *)((long)(this->delta)._M_elems + lVar3 + 4);
    if (fVar1 <= fVar5) {
      fVar1 = fVar5;
      paVar2 = paVar4;
    }
    paVar4 = paVar2;
    fVar5 = fVar1;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x3fc);
  return *(int *)((long)this + ((long)paVar4 - (long)in) * 2 + 0x600);
}

Assistant:

int
    decode(gsl::span<T const, N> input) noexcept
    {
        calculate_transition(input);
        math::normalize(gsl::span<T, N>(delta));

        return psi[
            math::element<T>::max(
                std::cbegin(delta),
                std::cend(delta)
            ).index
        ];
    }